

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void on_signal_close(int sig)

{
  FILE *__stream;
  bool bVar1;
  size_type sVar2;
  reference piVar3;
  mapped_type *pmVar4;
  rep current_time;
  sockaddr_in addr;
  sockaddr_in addr_00;
  sockaddr_in addr_01;
  duration<long,_std::ratio<1L,_1000000L>_> local_e8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_e0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_d8;
  duration cur_time;
  string local_c0 [32];
  uchar local_a0 [8];
  undefined8 local_98;
  string local_90 [36];
  int local_6c;
  iterator iStack_68;
  int ch;
  iterator __end2;
  iterator __begin2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  int local_48;
  int local_44;
  int new_parent;
  int sz;
  uchar local_38 [8];
  string local_30 [36];
  int local_c;
  int sig_local;
  
  local_c = sig;
  fprintf(_stderr,"Call exit function\n");
  if ((flag_root & 1U) == 0) {
    new_parent._0_2_ = my_addr.sin_family;
    new_parent._2_2_ = my_addr.sin_port;
    sz = my_addr.sin_addr.s_addr;
    local_38[0] = my_addr.sin_zero[0];
    local_38[1] = my_addr.sin_zero[1];
    local_38[2] = my_addr.sin_zero[2];
    local_38[3] = my_addr.sin_zero[3];
    local_38[4] = my_addr.sin_zero[4];
    local_38[5] = my_addr.sin_zero[5];
    local_38[6] = my_addr.sin_zero[6];
    local_38[7] = my_addr.sin_zero[7];
    addr.sin_zero = (uchar  [8])my_addr._0_8_;
    addr._0_8_ = local_30;
    pack_address_abi_cxx11_(addr);
    std::__cxx11::string::operator=((string *)tosend_address_abi_cxx11_,local_30);
    std::__cxx11::string::~string(local_30);
    create_new_message(2,id_parent);
  }
  __stream = _stderr;
  sVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(&children);
  fprintf(__stream,"Children size: %ld\n",sVar2);
  sVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(&children);
  local_44 = (int)sVar2;
  if (local_44 != 0) {
    if ((flag_root & 1U) == 0) {
      local_48 = id_parent;
    }
    else {
      __range2 = (set<int,_std::less<int>,_std::allocator<int>_> *)
                 std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&children);
      piVar3 = std::_Rb_tree_const_iterator<int>::operator*
                         ((_Rb_tree_const_iterator<int> *)&__range2);
      local_48 = *piVar3;
      create_new_message(4,local_48);
    }
    __end2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&children);
    iStack_68 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(&children);
    while (bVar1 = std::operator!=(&__end2,&stack0xffffffffffffff98), bVar1) {
      piVar3 = std::_Rb_tree_const_iterator<int>::operator*(&__end2);
      local_6c = *piVar3;
      if (local_6c != local_48) {
        pmVar4 = std::
                 map<int,_sockaddr_in,_std::less<int>,_std::allocator<std::pair<const_int,_sockaddr_in>_>_>
                 ::operator[](&connections,&local_48);
        local_a0 = *(uchar (*) [8])pmVar4;
        local_98 = *(undefined8 *)pmVar4->sin_zero;
        addr_00.sin_zero[0] = local_a0[0];
        addr_00.sin_zero[1] = local_a0[1];
        addr_00.sin_zero[2] = local_a0[2];
        addr_00.sin_zero[3] = local_a0[3];
        addr_00.sin_zero[4] = local_a0[4];
        addr_00.sin_zero[5] = local_a0[5];
        addr_00.sin_zero[6] = local_a0[6];
        addr_00.sin_zero[7] = local_a0[7];
        addr_00._0_8_ = local_90;
        pack_address_abi_cxx11_(addr_00);
        std::__cxx11::string::operator=((string *)tosend_address_abi_cxx11_,local_90);
        std::__cxx11::string::~string(local_90);
        create_new_message(3,local_6c);
        pmVar4 = std::
                 map<int,_sockaddr_in,_std::less<int>,_std::allocator<std::pair<const_int,_sockaddr_in>_>_>
                 ::operator[](&connections,&local_6c);
        cur_time.__r = *(rep *)pmVar4;
        addr_01.sin_zero[0] = (uchar)cur_time.__r;
        addr_01.sin_zero[1] = SUB81(cur_time.__r,1);
        addr_01.sin_zero[2] = SUB81(cur_time.__r,2);
        addr_01.sin_zero[3] = SUB81(cur_time.__r,3);
        addr_01.sin_zero[4] = SUB81(cur_time.__r,4);
        addr_01.sin_zero[5] = SUB81(cur_time.__r,5);
        addr_01.sin_zero[6] = SUB81(cur_time.__r,6);
        addr_01.sin_zero[7] = SUB81(cur_time.__r,7);
        addr_01._0_8_ = local_c0;
        pack_address_abi_cxx11_(addr_01);
        std::__cxx11::string::operator=((string *)tosend_address_abi_cxx11_,local_c0);
        std::__cxx11::string::~string(local_c0);
        create_new_message(5,local_48);
      }
      std::_Rb_tree_const_iterator<int>::operator++(&__end2);
    }
  }
  while (bVar1 = std::
                 map<std::pair<int,_int>,_long_long,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_long_long>_>_>
                 ::empty(&MT), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_e0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_d8.__r = (rep)std::chrono::
                        time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        ::time_since_epoch(&local_e0);
    local_e8.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                  (&local_d8);
    current_time = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_e8);
    check_and_resend(current_time);
  }
  exit(0);
}

Assistant:

void on_signal_close(int sig) {
    fprintf(stderr, "Call exit function\n");

    if (!flag_root) {
        tosend_address = pack_address(my_addr);
        create_new_message(LEFT, id_parent);
    }

    fprintf(stderr, "Children size: %ld\n", children.size());
    int sz = (int)children.size();
    if (sz) {
        int new_parent;
        if (flag_root) {
            new_parent = *children.begin();
            create_new_message(ROOT, new_parent);
        }
        else {
            new_parent = id_parent;
        }
        for (auto ch : children) {
            if (ch != new_parent) {
                tosend_address = pack_address(connections[new_parent]);
                create_new_message(PARENT, ch);
                tosend_address = pack_address(connections[ch]);
                create_new_message(CHILD, new_parent);
            }
        }
    }

    while (!MT.empty()) {
        auto cur_time = std::chrono::high_resolution_clock::now().time_since_epoch();
        check_and_resend(std::chrono::duration_cast<std::chrono::microseconds>(cur_time).count());
    }

    exit(0);
}